

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_class_decl_create
                    (gtoken_s token,char *identifier,gtoken_t access_specifier,
                    gtoken_t storage_specifier,gnode_t *superclass,gnode_r *protocols,
                    gnode_r *declarations,_Bool is_struct,gnode_t *decl)

{
  gnode_t *pgVar1;
  gnode_class_decl_t *node;
  _Bool is_struct_local;
  gnode_r *declarations_local;
  gnode_r *protocols_local;
  gnode_t *superclass_local;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  char *identifier_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0xa0);
  *(_Bool *)((long)&pgVar1[1].tag + 1) = is_struct;
  pgVar1->tag = NODE_CLASS_DECL;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  *(undefined1 *)&pgVar1[1].tag = NODE_LIST_STAT;
  *(char **)&pgVar1[1].token.colno = identifier;
  pgVar1[1].token.type = access_specifier;
  pgVar1[1].token.lineno = storage_specifier;
  *(gnode_t **)&pgVar1[1].token.bytes = superclass;
  pgVar1[1].token.value = (char *)protocols;
  *(gnode_r **)&pgVar1[1].is_assignment = declarations;
  pgVar1[2].block_length = 0;
  *(undefined4 *)&pgVar1[2].field_0xc = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_class_decl_create (gtoken_s token, const char *identifier, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_t *superclass,
                                  gnode_r *protocols, gnode_r *declarations, bool is_struct, gnode_t *decl) {
    gnode_class_decl_t *node = (gnode_class_decl_t *)mem_alloc(NULL, sizeof(gnode_class_decl_t));
    node->is_struct = is_struct;

    SETBASE(node, NODE_CLASS_DECL, token);
    SETDECL(node, decl);
    node->bridge = false;
    node->identifier = identifier;
    node->access = access_specifier;
    node->storage = storage_specifier;
    node->superclass = superclass;
    node->protocols = protocols;
    node->decls = declarations;
    node->nivar = 0;
    node->nsvar = 0;

    return (gnode_t *)node;
}